

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

bool Grammar::is_keyword_message_part(string *str)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  byte unaff_BPL;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  string local_88;
  string local_68;
  string local_48;
  
  uVar2 = (uint)str->_M_string_length;
  if ((int)uVar2 < 1) {
    bVar5 = false;
  }
  else {
    uVar3 = (ulong)(uVar2 & 0x7fffffff);
    bVar5 = true;
    uVar4 = 1;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4 - 1];
      if ((cVar1 == '?') || (cVar1 == ':')) {
        std::__cxx11::string::substr((ulong)&local_48,(ulong)str);
        bVar6 = is_keyword_message_token(&local_48);
        if (bVar6) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)str);
          str_utils::ltrim(&local_68,&local_88);
          unaff_BPL = is_keyword_message_argument(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        else {
          unaff_BPL = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        break;
      }
      bVar5 = uVar4 < uVar3;
      bVar6 = uVar4 != uVar3;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return (bool)(bVar5 & unaff_BPL);
}

Assistant:

bool Grammar::is_keyword_message_part(const std::string& str) {
    for (int i = 0; i < int(str.size()); i++)
        if (str[i] == ':' || str[i] == '?')
            return is_keyword_message_token(str.substr(0, i + 1)) &&
                   is_keyword_message_argument(str_utils::ltrim(str.substr(i + 1)));
    return false;
}